

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall
soul::heart::IODeclaration::checkDataTypesValid<soul::CodeLocation&>
          (IODeclaration *this,CodeLocation *errorLocation)

{
  PrimitiveType *pPVar1;
  Type *pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  pointer pTVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  value_type dataType;
  string local_168;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  if (this->endpointType == stream) {
    pTVar2 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pTVar2 != 0x18) {
      Errors::noMultipleTypesOnEndpoint<>();
      CodeLocation::throwError(errorLocation,&local_68);
    }
    Type::Type(&dataType,pTVar2);
    if (1 < (byte)(dataType.category - primitive)) {
      Errors::illegalTypeForEndpoint<>();
      CodeLocation::throwError(errorLocation,&local_d8);
    }
    if (dataType.primitiveType.type == void_) {
      Errors::voidCannotBeUsedForEndpoint<>();
      CodeLocation::throwError(errorLocation,&local_110);
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&dataType.structure);
  }
  pTVar4 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar5 = pTVar4;
  do {
    if (pTVar5 == pTVar3) {
      uVar6 = 1;
      do {
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18;
        if ((ulong)(((long)pTVar3 - (long)pTVar4) / 0x18) <= uVar6) {
          return;
        }
        lVar7 = 0;
        uVar8 = uVar6;
        while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
          pTVar5 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          bVar9 = Type::isEqual(pTVar5 + uVar6,(Type *)(&pTVar5->category + lVar7),4);
          if (bVar9) {
            Type::getDescription_abi_cxx11_
                      ((string *)&dataType,
                       (Type *)(&((this->dataTypes).
                                  super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->category + lVar7));
            Type::getDescription_abi_cxx11_
                      (&local_168,
                       (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar6);
            Errors::duplicateTypesInList<std::__cxx11::string,std::__cxx11::string>
                      (&local_148,(Errors *)&dataType,&local_168,args_1);
            CodeLocation::throwError(errorLocation,&local_148);
          }
          lVar7 = lVar7 + 0x18;
        }
        uVar6 = uVar6 + 1;
        pTVar4 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar3 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      } while( true );
    }
    pPVar1 = &pTVar5->primitiveType;
    pTVar5 = pTVar5 + 1;
  } while (pPVar1->type != void_);
  Errors::voidCannotBeUsedForEndpoint<>();
  CodeLocation::throwError(errorLocation,&local_a0);
}

Assistant:

void checkDataTypesValid (Thrower&& errorLocation)
        {
            if (isStreamEndpoint())
            {
                if (dataTypes.size() != 1)
                    errorLocation.throwError (Errors::noMultipleTypesOnEndpoint());

                auto dataType = dataTypes.front();

                if (! dataType.isPrimitiveOrVector())
                    errorLocation.throwError (Errors::illegalTypeForEndpoint());

                if (dataType.isVoid())
                    errorLocation.throwError (Errors::voidCannotBeUsedForEndpoint());
            }

            for (auto& dataType : dataTypes)
                if (dataType.isVoid())
                    errorLocation.throwError (Errors::voidCannotBeUsedForEndpoint());

            for (size_t i = 1; i < dataTypes.size(); ++i)
                for (size_t j = 0; j < i; ++j)
                    if (dataTypes[i].isEqual (dataTypes[j], Type::ignoreVectorSize1))
                        errorLocation.throwError (Errors::duplicateTypesInList (dataTypes[j].getDescription(),
                                                                                dataTypes[i].getDescription()));
        }